

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multisetTest.cpp
# Opt level: O0

void print<std::multiset<int,std::less<int>,std::allocator<int>>>
               (multiset<int,_std::less<int>,_std::allocator<int>_> *t,char *s)

{
  bool bVar1;
  ostream *poVar2;
  reference piVar3;
  _Self local_38;
  _Base_ptr local_30;
  int local_24;
  _Rb_tree_const_iterator<int> local_20;
  const_iterator it;
  char *s_local;
  multiset<int,_std::less<int>,_std::allocator<int>_> *t_local;
  
  it._M_node = (_Base_ptr)s;
  std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_20);
  local_24 = (int)std::setw(3);
  poVar2 = std::operator<<((ostream *)&std::cout,(_Setw)local_24);
  poVar2 = std::operator<<(poVar2,(char *)it._M_node);
  std::operator<<(poVar2," contains:");
  local_30 = (_Base_ptr)std::multiset<int,_std::less<int>,_std::allocator<int>_>::begin(t);
  local_20._M_node = local_30;
  while( true ) {
    local_38._M_node = (_Base_ptr)std::multiset<int,_std::less<int>,_std::allocator<int>_>::end(t);
    bVar1 = std::operator!=(&local_20,&local_38);
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)&std::cout,' ');
    piVar3 = std::_Rb_tree_const_iterator<int>::operator*(&local_20);
    std::ostream::operator<<(poVar2,*piVar3);
    std::_Rb_tree_const_iterator<int>::operator++(&local_20);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void	print(T const & t, char const * s)
{
	typename T::const_iterator	it;

	std::cout << std::setw(3) << s << " contains:";
	for (it = t.begin(); it != t.end(); ++it)
		std::cout << ' ' << *it;
	std::cout << std::endl;
}